

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

String * __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::BuildGLSLSource_abi_cxx11_
          (String *__return_storage_ptr__,ConversionStream *this)

{
  bool bVar1;
  reference pHVar2;
  HLSLTokenInfo *Token;
  iterator __end1;
  iterator __begin1;
  TokenListType *__range1;
  ConversionStream *this_local;
  String *Output;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::__cxx11::
           list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ::begin(&this->m_Tokens);
  Token = (HLSLTokenInfo *)
          std::__cxx11::
          list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
          ::end(&this->m_Tokens);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&Token), bVar1) {
    pHVar2 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator*(&__end1);
    if ((((pHVar2->Type != kw_linear) && (pHVar2->Type != kw_nointerpolation)) &&
        (pHVar2->Type != kw_noperspective)) &&
       ((pHVar2->Type != kw_centroid && (pHVar2->Type != kw_sample)))) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

String HLSL2GLSLConverterImpl::ConversionStream::BuildGLSLSource()
{
    String Output;
    for (const auto& Token : m_Tokens)
    {
        if ((Token.Type == TokenType::kw_linear ||
             Token.Type == TokenType::kw_nointerpolation ||
             Token.Type == TokenType::kw_noperspective ||
             Token.Type == TokenType::kw_centroid ||
             Token.Type == TokenType::kw_sample))
        {
            // Skip interpolation qualifiers.
            // We may get here if there are multiple shader functions in the same file.
            continue;
        }

        Output.append(Token.Delimiter);
        Output.append(Token.Literal);
    }
    return Output;
}